

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerGLSL::should_dereference(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIRVariable *pSVar3;
  SPIRExpression *pSVar4;
  SPIRExpression *expr;
  SPIRVariable *var;
  SPIRType *type;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  pSVar2 = Compiler::expression_type(&this->super_Compiler,id);
  if ((pSVar2->pointer & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Compiler::expression_is_lvalue(&this->super_Compiler,id);
    if (bVar1) {
      pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
      if (pSVar3 == (SPIRVariable *)0x0) {
        pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
        if (pSVar4 == (SPIRExpression *)0x0) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = (bool)((pSVar4->access_chain ^ 0xffU) & 1);
        }
      }
      else {
        this_local._7_1_ = (bool)(pSVar3->phi_variable & 1);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::should_dereference(uint32_t id)
{
	const auto &type = expression_type(id);
	// Non-pointer expressions don't need to be dereferenced.
	if (!type.pointer)
		return false;

	// Handles shouldn't be dereferenced either.
	if (!expression_is_lvalue(id))
		return false;

	// If id is a variable but not a phi variable, we should not dereference it.
	if (auto *var = maybe_get<SPIRVariable>(id))
		return var->phi_variable;

	// If id is an access chain, we should not dereference it.
	if (auto *expr = maybe_get<SPIRExpression>(id))
		return !expr->access_chain;

	// Otherwise, we should dereference this pointer expression.
	return true;
}